

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O3

int narrow_conv_backprop(NarrowConv *nc,IRRef ref,int depth)

{
  double dVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  uint *puVar5;
  jit_State *pjVar6;
  IRIns *pIVar7;
  NarrowIns *pNVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ptrdiff_t i_1;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  
  puVar5 = nc->sp;
  iVar10 = 10;
  if (puVar5 < nc->maxsp) {
    pjVar6 = nc->J;
    pIVar7 = (pjVar6->cur).ir;
    uVar15 = (ulong)ref;
    cVar2 = *(char *)((long)pIVar7 + uVar15 * 8 + 5);
    if (cVar2 == '\x1c') {
      dVar1 = *(double *)&pIVar7[uVar15 + 1].i;
      if ((nc->mode & 0xf000) == 0) {
        dVar16 = (double)(long)dVar1;
        if (dVar1 != dVar16) {
          return 10;
        }
        if (NAN(dVar1) || NAN(dVar16)) {
          return 10;
        }
        *puVar5 = 0x30000;
        nc->sp = puVar5 + 2;
        puVar5[1] = (uint)(long)dVar1;
      }
      else {
        uVar12 = (uint)dVar1;
        if ((int)(short)uVar12 != uVar12) {
          return 10;
        }
        if (dVar1 != (double)(int)dVar1) {
          return 10;
        }
        if (NAN(dVar1) || NAN((double)(int)dVar1)) {
          return 10;
        }
        *puVar5 = 0x30000;
        nc->sp = puVar5 + 2;
        puVar5[1] = uVar12;
      }
LAB_0015ad2e:
      iVar10 = 0;
    }
    else if ((cVar2 == '[') && ((*(ushort *)((long)pIVar7 + uVar15 * 8 + 2) & 0x1f) == 0x13)) {
      uVar4 = pIVar7[uVar15].field_0.op1;
      if ((nc->mode & 0xf000) < 0x1001) {
        narrow_stripov_backprop(nc,(uint)uVar4,depth + 1);
      }
      else {
        nc->sp = puVar5 + 1;
        *puVar5 = (uint)uVar4;
      }
      iVar10 = 0;
      if (nc->t == IRT_I64) {
        pNVar8 = nc->sp;
        nc->sp = pNVar8 + 1;
        *pNVar8 = 0x20000;
      }
    }
    else {
      bVar3 = (pjVar6->fold).ins.field_1.o;
      uVar4 = pjVar6->chain[bVar3];
      while (ref < uVar4) {
        uVar14 = (ulong)uVar4;
        if ((pIVar7[uVar14].field_0.op1 == ref) &&
           ((bVar3 == 0x5c ||
            (((nc->mode & 0xfff) == (*(ushort *)((long)pIVar7 + uVar14 * 8 + 2) & 0xfff) &&
             (((pjVar6->fold).ins.field_1.t.irt & 0x80) <=
              (*(byte *)((long)pIVar7 + uVar14 * 8 + 4) & 0x80))))))) {
          nc->sp = puVar5 + 1;
          *puVar5 = (uint)uVar4;
          goto LAB_0015ad2e;
        }
        uVar4 = *(ushort *)((long)pIVar7 + uVar14 * 8 + 6);
      }
      if ((byte)(cVar2 - 0x29U) < 2) {
        uVar12 = nc->mode;
        uVar9 = uVar12 | 0x1000;
        if ((uVar12 & 0xf000) != 0x2000) {
          uVar9 = uVar12;
        }
        if (depth < 1) {
          uVar9 = uVar12;
        }
        lVar13 = 0;
        do {
          if (((pjVar6->bpropcache[lVar13].key == (IRRef1)ref) &&
              (uVar12 = pjVar6->bpropcache[lVar13].mode, uVar9 <= uVar12)) &&
             (((uVar12 ^ uVar9) & 0xfff) == 0)) {
            uVar4 = pjVar6->bpropcache[lVar13].val;
            nc->sp = puVar5 + 1;
            *puVar5 = (uint)uVar4;
            goto LAB_0015ad2e;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x10);
        if (nc->t == IRT_I64) {
          lVar13 = 0;
          do {
            if ((pjVar6->bpropcache[lVar13].key == (IRRef1)ref) &&
               (uVar12 = pjVar6->bpropcache[lVar13].mode,
               0x226d < uVar12 && (uVar12 & 0xfff) == 0x26e)) {
              *puVar5 = (uint)pjVar6->bpropcache[lVar13].val;
              nc->sp = puVar5 + 2;
              puVar5[1] = 0x20000;
              goto LAB_0015ad2e;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x10);
        }
        if (depth < 99) {
          iVar10 = narrow_conv_backprop(nc,(uint)pIVar7[uVar15].field_0.op1,depth + 1);
          iVar11 = narrow_conv_backprop
                             (nc,(uint)*(ushort *)((long)pIVar7 + uVar15 * 8 + 2),depth + 1);
          if (iVar11 + iVar10 < 2) {
            bVar3 = *(byte *)((long)pIVar7 + uVar15 * 8 + 5);
            pNVar8 = nc->sp;
            nc->sp = pNVar8 + 1;
            *pNVar8 = (nc->t << 0x10 | (uint)bVar3 << 0x18) + ref;
            return iVar11 + iVar10;
          }
        }
      }
      nc->sp = puVar5 + 1;
      *puVar5 = ref + 0x10000;
      iVar10 = 1;
    }
  }
  return iVar10;
}

Assistant:

static int narrow_conv_backprop(NarrowConv *nc, IRRef ref, int depth)
{
  jit_State *J = nc->J;
  IRIns *ir = IR(ref);
  IRRef cref;

  if (nc->sp >= nc->maxsp) return 10;  /* Path too deep. */

  /* Check the easy cases first. */
  if (ir->o == IR_CONV && (ir->op2 & IRCONV_SRCMASK) == IRT_INT) {
    if ((nc->mode & IRCONV_CONVMASK) <= IRCONV_ANY)
      narrow_stripov_backprop(nc, ir->op1, depth+1);
    else
      *nc->sp++ = NARROWINS(NARROW_REF, ir->op1);  /* Undo conversion. */
    if (nc->t == IRT_I64)
      *nc->sp++ = NARROWINS(NARROW_SEXT, 0);  /* Sign-extend integer. */
    return 0;
  } else if (ir->o == IR_KNUM) {  /* Narrow FP constant. */
    lua_Number n = ir_knum(ir)->n;
    if ((nc->mode & IRCONV_CONVMASK) == IRCONV_TOBIT) {
      /* Allows a wider range of constants. */
      int64_t k64 = (int64_t)n;
      if (n == (lua_Number)k64) {  /* Only if const doesn't lose precision. */
	*nc->sp++ = NARROWINS(NARROW_INT, 0);
	*nc->sp++ = (NarrowIns)k64;  /* But always truncate to 32 bits. */
	return 0;
      }
    } else {
      int32_t k = lj_num2int(n);
      /* Only if constant is a small integer. */
      if (checki16(k) && n == (lua_Number)k) {
	*nc->sp++ = NARROWINS(NARROW_INT, 0);
	*nc->sp++ = (NarrowIns)k;
	return 0;
      }
    }
    return 10;  /* Never narrow other FP constants (this is rare). */
  }

  /* Try to CSE the conversion. Stronger checks are ok, too. */
  cref = J->chain[fins->o];
  while (cref > ref) {
    IRIns *cr = IR(cref);
    if (cr->op1 == ref &&
	(fins->o == IR_TOBIT ||
	 ((cr->op2 & IRCONV_MODEMASK) == (nc->mode & IRCONV_MODEMASK) &&
	  irt_isguard(cr->t) >= irt_isguard(fins->t)))) {
      *nc->sp++ = NARROWINS(NARROW_REF, cref);
      return 0;  /* Already there, no additional conversion needed. */
    }
    cref = cr->prev;
  }

  /* Backpropagate across ADD/SUB. */
  if (ir->o == IR_ADD || ir->o == IR_SUB) {
    /* Try cache lookup first. */
    IRRef mode = nc->mode;
    BPropEntry *bp;
    /* Inner conversions need a stronger check. */
    if ((mode & IRCONV_CONVMASK) == IRCONV_INDEX && depth > 0)
      mode += IRCONV_CHECK-IRCONV_INDEX;
    bp = narrow_bpc_get(nc->J, (IRRef1)ref, mode);
    if (bp) {
      *nc->sp++ = NARROWINS(NARROW_REF, bp->val);
      return 0;
    } else if (nc->t == IRT_I64) {
      /* Try sign-extending from an existing (checked) conversion to int. */
      mode = (IRT_INT<<5)|IRT_NUM|IRCONV_INDEX;
      bp = narrow_bpc_get(nc->J, (IRRef1)ref, mode);
      if (bp) {
	*nc->sp++ = NARROWINS(NARROW_REF, bp->val);
	*nc->sp++ = NARROWINS(NARROW_SEXT, 0);
	return 0;
      }
    }
    if (++depth < NARROW_MAX_BACKPROP && nc->sp < nc->maxsp) {
      NarrowIns *savesp = nc->sp;
      int count = narrow_conv_backprop(nc, ir->op1, depth);
      count += narrow_conv_backprop(nc, ir->op2, depth);
      if (count <= 1) {  /* Limit total number of conversions. */
	*nc->sp++ = NARROWINS(IRT(ir->o, nc->t), ref);
	return count;
      }
      nc->sp = savesp;  /* Too many conversions, need to backtrack. */
    }
  }

  /* Otherwise add a conversion. */
  *nc->sp++ = NARROWINS(NARROW_CONV, ref);
  return 1;
}